

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vardata.c
# Opt level: O1

int vardata_add_mode(vardata *data,char *name,char *description,int modeset)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  vardata_mode *pvVar6;
  
  if (data->validated == 0) {
    iVar2 = symtab_put(data->symtab,name,3,data->modesnum);
    if (iVar2 == -1) {
      iVar2 = -1;
    }
    else {
      iVar2 = data->modesnum;
      pcVar4 = strdup(name);
      if (description == (char *)0x0) {
        pcVar5 = (char *)0x0;
      }
      else {
        pcVar5 = strdup(description);
      }
      iVar1 = data->modesmax;
      if (iVar1 <= iVar2) {
        iVar3 = 0x10;
        if (iVar1 != 0) {
          iVar3 = iVar1 * 2;
        }
        data->modesmax = iVar3;
        pvVar6 = (vardata_mode *)realloc(data->modes,(long)iVar3 * 0x30);
        data->modes = pvVar6;
      }
      pvVar6 = data->modes;
      iVar1 = data->modesnum;
      data->modesnum = iVar1 + 1;
      pvVar6[iVar1].name = pcVar4;
      pvVar6[iVar1].description = pcVar5;
      pvVar6[iVar1].rfmask = (uint32_t *)0x0;
      (&pvVar6[iVar1].rfmask)[1] = (uint32_t *)0x0;
      pvVar6[iVar1].rfeaturesnum = 0;
      pvVar6[iVar1].rfeaturesmax = 0;
      pvVar6[iVar1].modeset = modeset;
      *(undefined4 *)&pvVar6[iVar1].field_0x2c = 0;
    }
    return iVar2;
  }
  abort();
}

Assistant:

int vardata_add_mode(struct vardata *data, const char *name, const char *description, int modeset) {
	if (data->validated)
		abort();
	if (symtab_put(data->symtab, name, VARDATA_ST_MODE, data->modesnum) == -1)
		return -1;
	int res = data->modesnum;
	struct vardata_mode new = { strdup(name), .modeset = modeset };
	if (description)
		new.description = strdup(description);
	ADDARRAY(data->modes, new);
	return res;
}